

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Tag::add_simple_tag(Tag *this,char *tag_name,char *tag_string)

{
  int iVar1;
  bool bVar2;
  SimpleTag *this_00;
  SimpleTag *st;
  char *tag_string_local;
  char *tag_name_local;
  Tag *this_local;
  
  bVar2 = ExpandSimpleTagsArray(this);
  if (bVar2) {
    iVar1 = this->simple_tags_count_;
    this->simple_tags_count_ = iVar1 + 1;
    this_00 = this->simple_tags_ + iVar1;
    SimpleTag::Init(this_00);
    bVar2 = SimpleTag::set_tag_name(this_00,tag_name);
    if (bVar2) {
      bVar2 = SimpleTag::set_tag_string(this_00,tag_string);
      if (bVar2) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Tag::add_simple_tag(const char* tag_name, const char* tag_string) {
  if (!ExpandSimpleTagsArray())
    return false;

  SimpleTag& st = simple_tags_[simple_tags_count_++];
  st.Init();

  if (!st.set_tag_name(tag_name))
    return false;

  if (!st.set_tag_string(tag_string))
    return false;

  return true;
}